

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib571.c
# Opt level: O0

size_t rtp_write(void *ptr,size_t size,size_t nmemb,void *stream)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int local_54;
  int i;
  size_t failure;
  int coded_size;
  int message_size;
  int channel;
  char *data;
  void *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  uVar1 = *(undefined1 *)((long)ptr + 1);
  uVar2 = (uint)CONCAT11(*(undefined1 *)((long)ptr + 2),*(undefined1 *)((long)ptr + 3));
  ptr_local = (void *)(long)(int)(uint)(size == 0 || nmemb == 0);
  iVar3 = curlx_uztosi(size * nmemb);
  uVar4 = iVar3 - 4;
  curl_mprintf("RTP: message size %d, channel %d\n",uVar4,uVar1);
  if (uVar4 == uVar2) {
    for (local_54 = 0; local_54 < (int)uVar4; local_54 = local_54 + 0xc) {
      if ((int)(uVar4 - local_54) < 0xd) {
        iVar3 = memcmp(RTP_DATA,(void *)((long)ptr + (long)local_54 + 4),
                       (long)(int)(uVar4 - local_54));
        if (iVar3 != 0) {
          curl_mprintf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",uVar4 - local_54,
                       (long)ptr + (long)local_54 + 4);
          return (size_t)ptr_local;
        }
      }
      else {
        iVar3 = memcmp(RTP_DATA,(void *)((long)ptr + (long)local_54 + 4),0xc);
        if (iVar3 != 0) {
          curl_mprintf("RTP PAYLOAD CORRUPTED [%s]\n",(long)ptr + (long)local_54 + 4);
          return (size_t)ptr_local;
        }
      }
    }
    rtp_packet_count = rtp_packet_count + 1;
    curl_mfprintf(_stderr,"packet count is %d\n",rtp_packet_count);
    ptr_local = (void *)(size * nmemb);
  }
  else {
    curl_mprintf("RTP embedded size (%d) does not match the write size (%d).\n",uVar2,uVar4);
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t rtp_write(void *ptr, size_t size, size_t nmemb, void *stream)
{
  char *data = (char *)ptr;
  int channel = RTP_PKT_CHANNEL(data);
  int message_size;
  int coded_size = RTP_PKT_LENGTH(data);
  size_t failure = (size && nmemb) ? 0 : 1;
  int i;
  (void)stream;

  message_size = curlx_uztosi(size * nmemb) - 4;

  printf("RTP: message size %d, channel %d\n", message_size, channel);
  if(message_size != coded_size) {
    printf("RTP embedded size (%d) does not match the write size (%d).\n",
           coded_size, message_size);
    return failure;
  }

  data += 4;
  for(i = 0; i < message_size; i += RTP_DATA_SIZE) {
    if(message_size - i > RTP_DATA_SIZE) {
      if(memcmp(RTP_DATA, data + i, RTP_DATA_SIZE) != 0) {
        printf("RTP PAYLOAD CORRUPTED [%s]\n", data + i);
        return failure;
      }
    }
    else {
      if(memcmp(RTP_DATA, data + i, message_size - i) != 0) {
        printf("RTP PAYLOAD END CORRUPTED (%d), [%s]\n",
               message_size - i, data + i);
        return failure;
      }
    }
  }

  rtp_packet_count++;
  fprintf(stderr, "packet count is %d\n", rtp_packet_count);

  return size * nmemb;
}